

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

void ssh1mainchan_request_pty(SshChannel *sc,_Bool want_reply,Conf *conf,int w,int h)

{
  char *str;
  long lVar1;
  ssh_ttymodes *psVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 auStack_a68 [161];
  uint local_560;
  BinarySink *local_558;
  BinarySink *local_550;
  ssh_ttymodes local_548;
  PktOut *local_38;
  PktOut *pktout;
  ssh1_connection_state *s;
  int h_local;
  int w_local;
  Conf *conf_local;
  SshChannel *pSStack_10;
  _Bool want_reply_local;
  SshChannel *sc_local;
  
  bVar4 = 0;
  pktout = (PktOut *)(sc + -2);
  s._0_4_ = h;
  s._4_4_ = w;
  _h_local = conf;
  conf_local._7_1_ = want_reply;
  pSStack_10 = sc;
  local_38 = ssh_bpp_new_pktout((BinaryPacketProtocol *)sc[0xd].cl,10);
  local_558 = local_38->binarysink_;
  str = conf_get_str((Conf *)pktout->length,0x35);
  BinarySink_put_stringz(local_558,str);
  BinarySink_put_uint32(local_38->binarysink_,(long)(int)s);
  BinarySink_put_uint32(local_38->binarysink_,(long)s._4_4_);
  BinarySink_put_uint32(local_38->binarysink_,0);
  BinarySink_put_uint32(local_38->binarysink_,0);
  local_550 = local_38->binarysink_;
  get_ttymodes_from_conf(&local_548,(Seat *)pktout[2].qnode.prev,_h_local);
  psVar2 = &local_548;
  puVar3 = auStack_a68;
  for (lVar1 = 0xa1; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *(undefined8 *)psVar2->have_mode;
    psVar2 = (ssh_ttymodes *)((long)psVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_560 = local_548.mode_val[0x101];
  write_ttymodes_to_packet(local_550,1);
  pq_base_push((PacketQueueBase *)pktout[2].minlen,&local_38->qnode);
  ssh1mainchan_queue_response((ssh1_connection_state *)pktout,(_Bool)(conf_local._7_1_ & 1),false);
  return;
}

Assistant:

static void ssh1mainchan_request_pty(
    SshChannel *sc, bool want_reply, Conf *conf, int w, int h)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_REQUEST_PTY);
    put_stringz(pktout, conf_get_str(s->conf, CONF_termtype));
    put_uint32(pktout, h);
    put_uint32(pktout, w);
    put_uint32(pktout, 0); /* width in pixels */
    put_uint32(pktout, 0); /* height in pixels */
    write_ttymodes_to_packet(
        BinarySink_UPCAST(pktout), 1,
        get_ttymodes_from_conf(s->ppl.seat, conf));
    pq_push(s->ppl.out_pq, pktout);

    ssh1mainchan_queue_response(s, want_reply, false);
}